

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint64_t LD_AwareHash(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  uint64_t uVar1;
  
  for (uVar1 = 0; n != uVar1; uVar1 = uVar1 + 1) {
    hash = hash * scale + (ulong)data[uVar1];
  }
  return hash ^ hardener;
}

Assistant:

uint64_t LD_AwareHash(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	while (n) {
		hash *= scale;
		hash += *data++;
		n--;
	}
	return hash ^ hardener;
}